

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

bool __thiscall Wasm::WasmBinaryReader::ProcessCurrentSection(WasmBinaryReader *this)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  FunctionBody *pFVar5;
  
  if ((this->m_currentSection).code == bSectLimit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                       ,0x4b,"(m_currentSection.code != bSectLimit)",
                       "m_currentSection.code != bSectLimit");
    if (!bVar2) goto LAB_00f1155e;
    *puVar3 = 0;
  }
  pFVar5 = (this->m_funcState).body;
  if (pFVar5 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmSectionPhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar5 = (this->m_funcState).body;
    }
    else {
      pFVar5 = (FunctionBody *)0x0;
    }
    pFVar4 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar4 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_00f1155e;
      *puVar3 = 0;
      pFVar4 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,WasmSectionPhase,sourceContextId,pFVar4->functionId);
  }
  if (bVar2 != false) {
    Output::Print(L"Process section %s");
    Output::Print(L"\n");
    Output::Flush();
  }
  this->m_readerState = READER_STATE_MODULE;
  switch((this->m_currentSection).code) {
  case bSectCustom:
    ReadCustomSection(this);
    break;
  case bSectType:
    ReadSignatureTypeSection(this);
    break;
  case bSectImport:
    ReadImportSection(this);
    break;
  case bSectFunction:
    ReadFunctionSignatures(this);
    break;
  case bSectTable:
    ReadTableSection(this,false);
    break;
  case bSectMemory:
    ReadMemorySection(this,false);
    break;
  case bSectGlobal:
    ReadGlobalSection(this);
    break;
  case bSectExport:
    ReadExportSection(this);
    break;
  case bSectStartFunction:
    ReadStartFunction(this);
    break;
  case bSectElement:
    ReadElementSection(this);
    break;
  case bSectFunctionBodies:
    ReadFunctionHeaders(this);
    break;
  case bSectData:
    ReadDataSection(this);
    break;
  case bSectName:
    ReadNameSection(this);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                       ,0x79,"((0))","UNREACHED");
    if (bVar2) {
      *puVar3 = 0;
      this->m_readerState = READER_STATE_UNKNOWN;
      return false;
    }
LAB_00f1155e:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this->m_readerState = READER_STATE_UNKNOWN;
  return this->m_pc == (this->m_currentSection).end;
}

Assistant:

bool WasmBinaryReader::ProcessCurrentSection()
{
    Assert(m_currentSection.code != bSectLimit);
    TRACE_WASM_SECTION(_u("Process section %s"), SectionInfo::All[m_currentSection.code].name);
    m_readerState = READER_STATE_MODULE;

    switch (m_currentSection.code)
    {
    case bSectMemory:
        ReadMemorySection(false);
        break;
    case bSectType:
        ReadSignatureTypeSection();
        break;
    case bSectImport:
        ReadImportSection();
        break;
    case bSectFunction:
        ReadFunctionSignatures();
        break;
    case bSectFunctionBodies:
        ReadFunctionHeaders();
        break;
    case bSectExport:
        ReadExportSection();
        break;
    case bSectStartFunction:
        ReadStartFunction();
        break;
    case bSectData:
        ReadDataSection();
        break;
    case bSectTable:
        ReadTableSection(false);
        break;
    case bSectElement:
        ReadElementSection();
        break;
    case bSectName:
        ReadNameSection();
        break;
    case bSectGlobal:
        ReadGlobalSection();
        break;
    case bSectCustom:
        ReadCustomSection();
        break;
    default:
        Assert(UNREACHED);
        m_readerState = READER_STATE_UNKNOWN;
        return false;
    }

    m_readerState = READER_STATE_UNKNOWN;

    return m_pc == m_currentSection.end;
}